

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::rehash
          (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *this,size_t sizeHint)

{
  uchar *puVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  Node<int,_QEvdevTouchScreenData::Contact> *pNVar10;
  ulong uVar11;
  Span *pSVar12;
  size_t index;
  long lVar13;
  size_t numBuckets;
  long lVar14;
  long in_FS_OFFSET;
  R RVar15;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if (0x40 < sizeHint) {
    if (sizeHint >> 0x3e == 0) {
      lVar13 = 0x3f;
      if (sizeHint != 0) {
        for (; sizeHint >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar13 ^ 0x3f) & 0x3f);
    }
    else {
      numBuckets = 0xffffffffffffffff;
    }
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar15 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar15.spans;
  this->numBuckets = numBuckets;
  pSVar12 = pSVar3;
  for (uVar11 = 0; uVar11 != uVar2 >> 7; uVar11 = uVar11 + 1) {
    for (lVar13 = 0; lVar13 != 0x80; lVar13 = lVar13 + 1) {
      uVar9 = (ulong)pSVar12->offsets[lVar13];
      if (uVar9 != 0xff) {
        pEVar4 = pSVar3[uVar11].entries;
        local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = findBucket<int>(this,(int *)(pEVar4 + uVar9));
        pNVar10 = Bucket::insert(&local_48);
        uVar5 = *(undefined8 *)pEVar4[uVar9].storage.data;
        uVar6 = *(undefined8 *)(pEVar4[uVar9].storage.data + 8);
        puVar1 = pEVar4[uVar9].storage.data + 0xc;
        uVar7 = *(undefined8 *)puVar1;
        uVar8 = *(undefined8 *)(puVar1 + 8);
        pNVar10->key = (int)uVar5;
        (pNVar10->value).trackingId = (int)((ulong)uVar5 >> 0x20);
        (pNVar10->value).x = (int)uVar6;
        (pNVar10->value).y = (int)((ulong)uVar6 >> 0x20);
        (pNVar10->value).y = (int)uVar7;
        (pNVar10->value).maj = (int)((ulong)uVar7 >> 0x20);
        (pNVar10->value).pressure = (int)uVar8;
        (pNVar10->value).state = (char)((ulong)uVar8 >> 0x20);
        *(int3 *)&(pNVar10->value).field_0x15 = (int3)((ulong)uVar8 >> 0x28);
      }
    }
    Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::freeData(pSVar3 + uVar11);
    pSVar12 = pSVar12 + 1;
  }
  if (pSVar3 != (Span *)0x0) {
    lVar13 = *(long *)&pSVar3[-1].allocated;
    if (lVar13 != 0) {
      lVar14 = lVar13 * 0x90;
      do {
        Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::freeData
                  ((Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)
                   (pSVar3[-1].offsets + lVar14));
        lVar14 = lVar14 + -0x90;
      } while (lVar14 != 0);
    }
    operator_delete__(&pSVar3[-1].allocated,lVar13 * 0x90 | 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }